

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendStamp.cpp
# Opt level: O0

void __thiscall OpenMD::BendStamp::~BendStamp(BendStamp *this)

{
  BendStamp *in_RDI;
  
  ~BendStamp(in_RDI);
  operator_delete(in_RDI,0xf0);
  return;
}

Assistant:

BendStamp::~BendStamp() {}